

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderstate.h
# Opt level: O2

void __thiscall FRenderState::EnableClipLine(FRenderState *this,bool on)

{
  _func_void_GLenum **pp_Var1;
  
  if (((byte)gl.flags & 0x20) == 0) {
    this->mClipLineEnabled = on;
    if (on) {
      pp_Var1 = &_ptrc_glEnable;
    }
    else {
      pp_Var1 = &_ptrc_glDisable;
    }
    (**pp_Var1)(0x3000);
    return;
  }
  return;
}

Assistant:

void EnableClipLine(bool on)
	{
		if (!(gl.flags & RFL_NO_CLIP_PLANES))
		{
			mClipLineEnabled = on;
			if (on)
			{
				glEnable(GL_CLIP_DISTANCE0);
			}
			else
			{
				glDisable(GL_CLIP_DISTANCE0);
			}
		}
	}